

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O0

bool __thiscall
cfgfile::lexical_analyzer_t<cfgfile::qstring_trait_t>::is_space_char
          (lexical_analyzer_t<cfgfile::qstring_trait_t> *this,char_t ch)

{
  bool bVar1;
  QChar in_SI;
  
  bVar1 = ::operator==(in_SI,const_t<cfgfile::qstring_trait_t>::c_space);
  if ((((!bVar1) && (bVar1 = ::operator==(in_SI,const_t<cfgfile::qstring_trait_t>::c_tab), !bVar1))
      && (bVar1 = ::operator==(in_SI,const_t<cfgfile::qstring_trait_t>::c_carriage_return), !bVar1))
     && (bVar1 = ::operator==(in_SI,const_t<cfgfile::qstring_trait_t>::c_line_feed), !bVar1)) {
    return false;
  }
  return true;
}

Assistant:

bool is_space_char( typename Trait::char_t ch )
	{
		if( ch == const_t< Trait >::c_space || ch == const_t< Trait >::c_tab ||
			ch == const_t< Trait >::c_carriage_return ||
			ch == const_t< Trait >::c_line_feed )
				return true;
		else
			return false;
	}